

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O0

int32_t __thiscall icu_63::OffsetList::popMinimum(OffsetList *this)

{
  int iVar1;
  int iVar2;
  int local_1c;
  int32_t result;
  int32_t i;
  OffsetList *this_local;
  
  local_1c = this->start;
  do {
    local_1c = local_1c + 1;
    if (this->capacity <= local_1c) {
      iVar1 = this->capacity;
      iVar2 = this->start;
      for (local_1c = 0; this->list[local_1c] == '\0'; local_1c = local_1c + 1) {
      }
      this->list[local_1c] = '\0';
      this->length = this->length + -1;
      this->start = local_1c;
      return local_1c + (iVar1 - iVar2);
    }
  } while (this->list[local_1c] == '\0');
  this->list[local_1c] = '\0';
  this->length = this->length + -1;
  iVar1 = this->start;
  this->start = local_1c;
  return local_1c - iVar1;
}

Assistant:

int32_t popMinimum() {
        // Look for the next offset in list[start+1..capacity-1].
        int32_t i=start, result;
        while(++i<capacity) {
            if(list[i]) {
                list[i]=FALSE;
                --length;
                result=i-start;
                start=i;
                return result;
            }
        }
        // i==capacity

        // Wrap around and look for the next offset in list[0..start].
        // Since the list is not empty, there will be one.
        result=capacity-start;
        i=0;
        while(!list[i]) {
            ++i;
        }
        list[i]=FALSE;
        --length;
        start=i;
        return result+=i;
    }